

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergePartialFromCodedStream
          (WordTagger *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  StringVector *value;
  string *psVar6;
  char *field_name;
  char cVar7;
  uint uVar8;
  int size;
  ulong uVar9;
  pointer data;
  
LAB_0021333c:
  pbVar3 = input->buffer_;
  uVar5 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar9 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar8 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar5 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
      goto LAB_0021358a;
      uVar9 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar9 = uVar9 | 0x100000000;
  }
  else {
LAB_0021358a:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar9 = 0;
    if (uVar5 - 1 < 0x3fff) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar5 | uVar9;
  }
  uVar5 = (uint32)uVar9;
  if ((uVar9 & 0x100000000) == 0) goto LAB_00213399;
  uVar8 = (uint)(uVar9 >> 3) & 0x1fffffff;
  cVar7 = (char)uVar9;
  switch(uVar8) {
  case 0x14:
    if (cVar7 != -0x5e) goto LAB_00213399;
    psVar6 = mutable_tokensoutputfeaturename_abi_cxx11_(this);
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar4) {
      return false;
    }
    psVar6 = (this->tokensoutputfeaturename_).ptr_;
    data = (psVar6->_M_dataplus)._M_p;
    size = (int)psVar6->_M_string_length;
    field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName";
    break;
  case 0x15:
    if (cVar7 != -0x56) goto LAB_00213399;
    psVar6 = mutable_tokentagsoutputfeaturename_abi_cxx11_(this);
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar4) {
      return false;
    }
    psVar6 = (this->tokentagsoutputfeaturename_).ptr_;
    data = (psVar6->_M_dataplus)._M_p;
    size = (int)psVar6->_M_string_length;
    field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName";
    break;
  case 0x16:
    if (cVar7 != -0x4e) goto LAB_00213399;
    psVar6 = mutable_tokenlocationsoutputfeaturename_abi_cxx11_(this);
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar4) {
      return false;
    }
    psVar6 = (this->tokenlocationsoutputfeaturename_).ptr_;
    data = (psVar6->_M_dataplus)._M_p;
    size = (int)psVar6->_M_string_length;
    field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName";
    break;
  case 0x17:
    if (cVar7 != -0x46) goto LAB_00213399;
    psVar6 = mutable_tokenlengthsoutputfeaturename_abi_cxx11_(this);
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar4) {
      return false;
    }
    psVar6 = (this->tokenlengthsoutputfeaturename_).ptr_;
    data = (psVar6->_M_dataplus)._M_p;
    size = (int)psVar6->_M_string_length;
    field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName";
    break;
  default:
    if (uVar8 == 200) {
      if (cVar7 == 'B') {
        value = mutable_stringtags(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value);
        goto LAB_002133ba;
      }
LAB_00213399:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      if (uVar8 == 10) {
        if (cVar7 == 'R') {
          psVar6 = mutable_language_abi_cxx11_(this);
          bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
          if (!bVar4) {
            return false;
          }
          psVar6 = (this->language_).ptr_;
          data = (psVar6->_M_dataplus)._M_p;
          size = (int)psVar6->_M_string_length;
          field_name = "CoreML.Specification.CoreMLModels.WordTagger.language";
          break;
        }
        goto LAB_00213399;
      }
      if (uVar8 == 100) {
        if (cVar7 != '\"') goto LAB_00213399;
        psVar6 = mutable_modelparameterdata_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      }
      else {
        if ((uVar8 != 1) || (cVar7 != '\b')) goto LAB_00213399;
        bVar4 = google::protobuf::io::CodedInputStream::ReadVarint32(input,&this->revision_);
      }
    }
LAB_002133ba:
    if (bVar4 == false) {
      return false;
    }
    goto LAB_0021333c;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,size,PARSE,field_name);
  if (!bVar4) {
    return false;
  }
  goto LAB_0021333c;
}

Assistant:

bool WordTagger::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordTagger)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokensOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokensoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokensoutputfeaturename().data(), this->tokensoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenTagsOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokentagsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokentagsoutputfeaturename().data(), this->tokentagsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLocationsOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlocationsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlocationsoutputfeaturename().data(), this->tokenlocationsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLengthsOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlengthsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlengthsoutputfeaturename().data(), this->tokenlengthsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringTags = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtags()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordTagger)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordTagger)
  return false;
#undef DO_
}